

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportFailureInUnknownLocation(Type result_type,String *message)

{
  UnitTest *this;
  String *in_stack_000000d8;
  String *in_stack_000000e0;
  int in_stack_000000ec;
  char *in_stack_000000f0;
  Type in_stack_000000fc;
  UnitTest *in_stack_00000100;
  String local_20 [2];
  
  this = UnitTest::GetInstance();
  String::String(local_20);
  UnitTest::AddTestPartResult
            (in_stack_00000100,in_stack_000000fc,in_stack_000000f0,in_stack_000000ec,
             in_stack_000000e0,in_stack_000000d8);
  String::~String((String *)this);
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const String& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      String());  // No stack trace, either.
}